

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_roll_indent
              (yaml_parser_t *parser,ptrdiff_t column,ptrdiff_t number,yaml_token_type_t type,
              yaml_mark_t mark)

{
  int *piVar1;
  yaml_token_t *__dest;
  int iVar2;
  yaml_token_type_t local_80 [2];
  yaml_token_t token;
  yaml_token_type_t type_local;
  ptrdiff_t number_local;
  ptrdiff_t column_local;
  yaml_parser_t *parser_local;
  
  if (parser->flow_level != 0) {
    return 1;
  }
  if (parser->indent < column) {
    token.end_mark.column._4_4_ = type;
    if (((parser->indents).top == (parser->indents).end) &&
       (iVar2 = yaml_stack_extend(&(parser->indents).start,&(parser->indents).top,
                                  &(parser->indents).end), iVar2 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    iVar2 = parser->indent;
    piVar1 = (parser->indents).top;
    (parser->indents).top = piVar1 + 1;
    *piVar1 = iVar2;
    if (0x7fffffff < column) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    parser->indent = (int)column;
    memset(local_80,0,0x50);
    local_80[0] = token.end_mark.column._4_4_;
    token.data._16_8_ = mark.index;
    token.start_mark.index = mark.line;
    token.start_mark.line = mark.column;
    token.start_mark.column = mark.index;
    token.end_mark.index = mark.line;
    token.end_mark.line = mark.column;
    if (number == -1) {
      if (((parser->tokens).tail == (parser->tokens).end) &&
         (iVar2 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                    &(parser->tokens).tail,&(parser->tokens).end), iVar2 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      __dest = (parser->tokens).tail;
      (parser->tokens).tail = __dest + 1;
      memcpy(__dest,local_80,0x50);
    }
    else {
      if (((parser->tokens).tail == (parser->tokens).end) &&
         (iVar2 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                    &(parser->tokens).tail,&(parser->tokens).end), iVar2 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      memmove((parser->tokens).head + (number - parser->tokens_parsed) + 1,
              (parser->tokens).head + (number - parser->tokens_parsed),
              (((long)(parser->tokens).tail - (long)(parser->tokens).head) / 0x50 -
              (number - parser->tokens_parsed)) * 0x50);
      memcpy((parser->tokens).head + (number - parser->tokens_parsed),local_80,0x50);
      (parser->tokens).tail = (parser->tokens).tail + 1;
    }
  }
  return 1;
}

Assistant:

static int
yaml_parser_roll_indent(yaml_parser_t *parser, ptrdiff_t column,
        ptrdiff_t number, yaml_token_type_t type, yaml_mark_t mark)
{
    yaml_token_t token;

    /* In the flow context, do nothing. */

    if (parser->flow_level)
        return 1;

    if (parser->indent < column)
    {
        /*
         * Push the current indentation level to the stack and set the new
         * indentation level.
         */

        if (!PUSH(parser, parser->indents, parser->indent))
            return 0;

        if (column > INT_MAX) {
            parser->error = YAML_MEMORY_ERROR;
            return 0;
        }

        parser->indent = column;

        /* Create a token and insert it into the queue. */

        TOKEN_INIT(token, type, mark, mark);

        if (number == -1) {
            if (!ENQUEUE(parser, parser->tokens, token))
                return 0;
        }
        else {
            if (!QUEUE_INSERT(parser,
                        parser->tokens, number - parser->tokens_parsed, token))
                return 0;
        }
    }

    return 1;
}